

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O2

void __thiscall
websocketpp::http::parser::request::process(request *this,iterator begin,iterator end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  exception *peVar4;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p._0_1_ = 0x20;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (begin._M_current,end._M_current);
  if (_Var2._M_current == end._M_current) {
    peVar4 = (exception *)__cxa_allocate_exception(0x70);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Invalid request line1",&local_91);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_70.field_2._M_local_buf[0] = '\0';
    exception::exception(peVar4,&local_90,bad_request,&local_50,&local_70);
    __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
  }
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_90,begin._M_current,_Var2._M_current);
  set_method(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  local_90._M_dataplus._M_p._0_1_ = 0x20;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var2._M_current + 1,end._M_current,&local_90);
  if (_Var3._M_current != end._M_current) {
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_90,_Var2._M_current + 1,_Var3._M_current);
    std::__cxx11::string::_M_assign((string *)&this->m_uri);
    std::__cxx11::string::~string((string *)&local_90);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_90,_Var3._M_current + 1,end._M_current);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  peVar4 = (exception *)__cxa_allocate_exception(0x70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"Invalid request line2",&local_91);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70.field_2._M_local_buf[0] = '\0';
  exception::exception(peVar4,&local_90,bad_request,&local_50,&local_70);
  __cxa_throw(peVar4,&exception::typeinfo,exception::~exception);
}

Assistant:

inline void request::process(std::string::iterator begin, std::string::iterator
    end)
{
    std::string::iterator cursor_start = begin;
    std::string::iterator cursor_end = std::find(begin,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line1",status_code::bad_request);
    }

    set_method(std::string(cursor_start,cursor_end));

    cursor_start = cursor_end+1;
    cursor_end = std::find(cursor_start,end,' ');

    if (cursor_end == end) {
        throw exception("Invalid request line2",status_code::bad_request);
    }

    set_uri(std::string(cursor_start,cursor_end));
    set_version(std::string(cursor_end+1,end));
}